

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.cc
# Opt level: O2

void __thiscall leveldb::anon_unknown_4::EmptyIterator::EmptyIterator(EmptyIterator *this,Status *s)

{
  (this->super_Iterator).cleanup_head_.function = (CleanupFunction)0x0;
  (this->super_Iterator).cleanup_head_.next = (CleanupNode *)0x0;
  (this->super_Iterator)._vptr_Iterator = (_func_int **)&PTR__EmptyIterator_0013a3f0;
  Status::Status(&this->status_,s);
  return;
}

Assistant:

EmptyIterator(const Status& s) : status_(s) {}